

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O2

void __thiscall
xlib::Log::SWrite<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (Log *this,LOG_PRIORITY pri,char *file,uint32_t line,char *function,bool br,string *format
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)format);
  Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_50,args,args_1,args_2);
  Write(this,pri,file,line,function,br,local_50._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void SWrite(LOG_PRIORITY pri, const char* file, uint32_t line, const char* function,
        bool br, const std::string& format, const Args&... args) {
        std::string temp(format);
        Format(&temp, args...);
        Write(pri, file, line, function, br, temp.c_str());
    }